

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintExpressionContents::visitArrayNew(PrintExpressionContents *this,ArrayNew *curr)

{
  ostream *poVar1;
  undefined8 in_RAX;
  HeapType type;
  undefined8 uStack_28;
  
  poVar1 = this->o;
  uStack_28 = in_RAX;
  Colors::outputColorCode(poVar1,"\x1b[35m");
  Colors::outputColorCode(poVar1,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"array.new",9);
  Colors::outputColorCode(poVar1,"\x1b[0m");
  if (curr->init == (Expression *)0x0) {
    poVar1 = this->o;
    Colors::outputColorCode(poVar1,"\x1b[35m");
    Colors::outputColorCode(poVar1,"\x1b[1m");
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"_default",8);
    Colors::outputColorCode(poVar1,"\x1b[0m");
  }
  uStack_28 = CONCAT17(0x20,(undefined7)uStack_28);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)((long)&uStack_28 + 7),1);
  type = wasm::Type::getHeapType
                   (&(curr->super_SpecificExpression<(wasm::Expression::Id)70>).super_Expression.
                     type);
  PrintSExpression::printHeapTypeName(this->parent,type);
  return;
}

Assistant:

void visitArrayNew(ArrayNew* curr) {
    printMedium(o, "array.new");
    if (curr->isWithDefault()) {
      printMedium(o, "_default");
    }
    o << ' ';
    printHeapTypeName(curr->type.getHeapType());
  }